

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O1

int metacall_load_from_file(char *tag,char **paths,size_t size,void **handle)

{
  int iVar1;
  loader_path *paths_00;
  size_t sVar2;
  loader_path *__dest;
  
  if ((size != 0) && (paths_00 = (loader_path *)malloc(size << 0xc), paths_00 != (loader_path *)0x0)
     ) {
    sVar2 = 0;
    __dest = paths_00;
    do {
      strncpy(*__dest,paths[sVar2],0x1000);
      sVar2 = sVar2 + 1;
      __dest = __dest + 1;
    } while (size != sVar2);
    iVar1 = loader_load_from_file(tag,paths_00,size,handle);
    free(paths_00);
    return iVar1;
  }
  return 1;
}

Assistant:

int metacall_load_from_file(const char *tag, const char *paths[], size_t size, void **handle)
{
	loader_path *path_impl;
	size_t iterator;

	if (size == 0)
	{
		return 1;
	}

	path_impl = (loader_path *)malloc(sizeof(loader_path) * size);

	if (path_impl == NULL)
	{
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		strncpy(path_impl[iterator], paths[iterator], LOADER_PATH_SIZE);
	}

	int result = loader_load_from_file(tag, (const loader_path *)path_impl, size, handle);

	free(path_impl);

	return result;
}